

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void Cmd_pings(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  userinfo_t *this;
  long lVar4;
  bool *pbVar5;
  
  this = (userinfo_t *)&DAT_009ba458;
  pbVar5 = playeringame;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
    if (*pbVar5 == true) {
      iVar1 = *(int *)((long)currrecvtime + lVar4);
      iVar2 = *(int *)((long)lastrecvtime + lVar4);
      pcVar3 = userinfo_t::GetName(this);
      Printf("% 4d %s\n",(ulong)(uint)(iVar1 - iVar2),pcVar3);
    }
    pbVar5 = pbVar5 + 1;
    this = this + 0x1c;
  }
  return;
}

Assistant:

CCMD (pings)
{
	int i;
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			Printf ("% 4d %s\n", currrecvtime[i] - lastrecvtime[i],
					players[i].userinfo.GetName());
}